

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refine_peaks.cpp
# Opt level: O2

void trt_pose::parse::refine_peaks_out_nchw
               (float *refined_peaks,int *counts,int *peaks,float *cmap,int N,int C,int H,int W,
               int M,int window_size)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  iVar1 = 0;
  if (N < 1) {
    N = 0;
  }
  uVar3 = (ulong)(uint)N;
  iVar2 = 0;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    refine_peaks_out_chw
              (refined_peaks + iVar1,counts,peaks + iVar1,cmap + iVar2,C,H,W,M,window_size);
    iVar2 = iVar2 + W * H * C;
    iVar1 = iVar1 + M * C * 2;
    counts = counts + C;
  }
  return;
}

Assistant:

void refine_peaks_out_nchw(float *refined_peaks, // NxCxMx2
                           const int *counts,    // NxC
                           const int *peaks,     // NxCxMx2
                           const float *cmap, const int N, const int C,
                           const int H, const int W, const int M,
                           const int window_size) {
  for (int n = 0; n < N; n++) {
    refine_peaks_out_chw(&refined_peaks[n * C * M * 2], &counts[n * C],
                         &peaks[n * C * M * 2], &cmap[n * C * H * W], C, H, W,
                         M, window_size);
  }
}